

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall
cmListFileParser::ParseString(cmListFileParser *this,char *str,char *virtual_filename)

{
  int iVar1;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *virtual_filename_local;
  char *str_local;
  cmListFileParser *this_local;
  
  this->FileName = virtual_filename;
  local_28 = virtual_filename;
  virtual_filename_local = str;
  str_local = (char *)this;
  iVar1 = cmListFileLexer_SetString(this->Lexer,str);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"cmListFileCache: cannot allocate buffer.",&local_49);
    IssueFileOpenError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = Parse(this);
  }
  return this_local._7_1_;
}

Assistant:

bool cmListFileParser::ParseString(const char* str,
                                   const char* virtual_filename)
{
  this->FileName = virtual_filename;

  if (!cmListFileLexer_SetString(this->Lexer, str)) {
    this->IssueFileOpenError("cmListFileCache: cannot allocate buffer.");
    return false;
  }

  return this->Parse();
}